

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O0

ConsumeResult * __thiscall
binlog::Session::consume<std::ostream>
          (Session *this,basic_ostream<char,_std::char_traits<char>_> *out)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  streamsize sVar4;
  QueueReader *this_00;
  long lVar5;
  Queue *q;
  iterator iVar6;
  iterator iVar7;
  char *in_RDX;
  long in_RSI;
  ConsumeResult *in_RDI;
  __normal_iterator<const_std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  *this_01;
  ReadResult data;
  QueueReader reader;
  Channel *ch;
  bool isClosed;
  shared_ptr<binlog::Session::Channel> *channelptr;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  *__range2;
  streamsize sourceWriteSize;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffea8;
  QueueReader *in_stack_fffffffffffffeb0;
  __shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffec0;
  WriterProp *in_stack_fffffffffffffec8;
  const_iterator in_stack_fffffffffffffed0;
  const_iterator in_stack_fffffffffffffed8;
  ReadResult local_90;
  QueueReader local_70;
  element_type *local_60;
  byte local_51;
  reference local_50;
  shared_ptr<binlog::Session::Channel> *local_48;
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  local_40;
  long local_38;
  long local_30;
  char *local_10;
  
  local_10 = in_RDX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  ConsumeResult::ConsumeResult(in_RDI);
  pcVar1 = local_10;
  if ((*(byte *)(in_RSI + 0x8a) & 1) != 0) {
    pcVar3 = detail::RecoverableVectorOutputStream::data((RecoverableVectorOutputStream *)0x10a94b);
    detail::RecoverableVectorOutputStream::ssize((RecoverableVectorOutputStream *)0x10a963);
    std::ostream::write(pcVar1,(long)pcVar3);
    sVar4 = detail::RecoverableVectorOutputStream::ssize((RecoverableVectorOutputStream *)0x10a991);
    in_RDI->bytesConsumed = sVar4 + in_RDI->bytesConsumed;
    *(undefined1 *)(in_RSI + 0x8a) = 0;
  }
  this_00 = (QueueReader *)
            detail::RecoverableVectorOutputStream::ssize((RecoverableVectorOutputStream *)0x10a9f0);
  pcVar1 = local_10;
  local_30 = (long)this_00 - *(long *)(in_RSI + 0x70);
  pcVar3 = detail::RecoverableVectorOutputStream::data((RecoverableVectorOutputStream *)0x10aa29);
  std::ostream::write(pcVar1,(long)(pcVar3 + *(long *)(in_RSI + 0x70)));
  *(long *)(in_RSI + 0x70) = local_30 + *(long *)(in_RSI + 0x70);
  in_RDI->bytesConsumed = local_30 + in_RDI->bytesConsumed;
  local_38 = in_RSI + 0x28;
  local_40._M_current =
       (shared_ptr<binlog::Session::Channel> *)
       std::
       vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
       ::begin((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                *)in_stack_fffffffffffffea8);
  local_48 = (shared_ptr<binlog::Session::Channel> *)
             std::
             vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
             ::end((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                    *)in_stack_fffffffffffffea8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar2) break;
    local_50 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
               ::operator*(&local_40);
    lVar5 = std::__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>::use_count
                      ((__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *)
                       0x10aaf9);
    local_51 = lVar5 == 1;
    local_60 = std::
               __shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_fffffffffffffeb0);
    q = Channel::queue((Channel *)0x10ab27);
    detail::QueueReader::QueueReader(&local_70,q);
    detail::QueueReader::beginRead(this_00);
    in_stack_fffffffffffffed8._M_current =
         (shared_ptr<binlog::Session::Channel> *)detail::QueueReader::ReadResult::size(&local_90);
    if (in_stack_fffffffffffffed8._M_current != (shared_ptr<binlog::Session::Channel> *)0x0) {
      in_stack_fffffffffffffed0._M_current =
           (shared_ptr<binlog::Session::Channel> *)detail::QueueReader::ReadResult::size(&local_90);
      (local_60->writerProp).batchSize = (uint64_t)in_stack_fffffffffffffed0._M_current;
      in_stack_fffffffffffffec8 =
           (WriterProp *)
           consumeSpecialEntry<binlog::WriterProp,std::ostream>
                     ((Session *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8,
                      (basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec0);
      in_RDI->bytesConsumed = (long)&in_stack_fffffffffffffec8->id + in_RDI->bytesConsumed;
      std::ostream::write(local_10,(long)local_90.buffer1);
      if (local_90.size2 != 0) {
        std::ostream::write(local_10,(long)local_90.buffer2);
      }
      detail::QueueReader::endRead(in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffec0 =
           (__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *)
           detail::QueueReader::ReadResult::size(&local_90);
      in_RDI->bytesConsumed = (long)&in_stack_fffffffffffffec0->_M_ptr + in_RDI->bytesConsumed;
    }
    if ((local_51 & 1) != 0) {
      std::__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>::reset
                (in_stack_fffffffffffffec0);
      in_RDI->channelsRemoved = in_RDI->channelsRemoved + 1;
    }
    in_RDI->channelsPolled = in_RDI->channelsPolled + 1;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
    ::operator++(&local_40);
  }
  this_01 = (__normal_iterator<const_std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
             *)(in_RSI + 0x28);
  iVar6 = std::
          vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
          ::begin((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                   *)in_stack_fffffffffffffea8);
  iVar7 = std::
          vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
          ::end((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                 *)in_stack_fffffffffffffea8);
  std::
  remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>,binlog::Session::consume<std::ostream>(std::ostream&)::_lambda(std::shared_ptr<binlog::Session::Channel>const&)_1_>
            (iVar6._M_current,iVar7._M_current);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>const*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>
  ::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*>
            (this_01,(__normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
                      *)in_stack_fffffffffffffea8);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::end((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
         *)in_stack_fffffffffffffea8);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>const*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>
  ::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*>
            (this_01,(__normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
                      *)in_stack_fffffffffffffea8);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::erase((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
           *)in_stack_fffffffffffffec8,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  *(size_t *)(in_RSI + 0x80) = in_RDI->bytesConsumed + *(long *)(in_RSI + 0x80);
  in_RDI->totalBytesConsumed = *(size_t *)(in_RSI + 0x80);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10ad96);
  return in_RDI;
}

Assistant:

Session::ConsumeResult Session::consume(OutputStream& out)
{
  // This lock:
  //  - Ensures only a single consumer is running at a time
  //  - Ensures safe read of _channels
  //  - Ensures safe read of Channel::writerProp (written by setChannelWriterName)
  //  - Ensures safe read of _sources
  //  - Ensures no new EventSource can be added to _sources while consuming
  //
  // Without this lock, the following becomes possible:
  //  - Consumer starts, consumes _sources
  //  - Producer1 adds a new elem (ES123) to sources
  //  - Producer2 finds that ES123 is already added
  //  - Producer2 adds a new event using ES123
  //  - Consumer continues, consumes the event added by Producer2
  // This would result in a corrupt stream, as the event source
  // must precede every event referencing it. This is solved by the lock
  // that blocks P1 *and* P2 while adding ES123.
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add a clock sync if not yet added
  if (_consumeClockSync)
  {
    out.write(_clockSync.data(), _clockSync.ssize());
    result.bytesConsumed += std::size_t(_clockSync.ssize());
    _consumeClockSync = false;
  }

  // consume event sources before events
  const std::streamsize sourceWriteSize = _sources.ssize() - _sourcesConsumePos;
  out.write(_sources.data() + _sourcesConsumePos, sourceWriteSize);
  _sourcesConsumePos += sourceWriteSize;
  result.bytesConsumed += std::size_t(sourceWriteSize);

  // consume some events
  for (std::shared_ptr<Channel>& channelptr : _channels)
  {
    // Important to check if channel is closed before beginRead,
    // otherwise the following race becomes possible:
    //  - Consumer finds queue is empty
    //  - Producer adds data
    //  - Producer closes the queue
    //  - Consumer finds queue is closed, removes it -> data loss
    const bool isClosed = (channelptr.use_count() == 1);

    Channel& ch = *channelptr;

    detail::QueueReader reader(ch.queue());
    const detail::QueueReader::ReadResult data = reader.beginRead();
    if (data.size())
    {
      // consume writerProp entry
      ch.writerProp.batchSize = data.size();
      result.bytesConsumed += consumeSpecialEntry(ch.writerProp, out);

      // consume queue data
      out.write(data.buffer1, std::streamsize(data.size1));
      if (data.size2)
      {
        // data wraps around the end of the queue, consume the second half as well
        out.write(data.buffer2, std::streamsize(data.size2));
      }

      reader.endRead();
      result.bytesConsumed += data.size();
    }

    if (isClosed)
    {
      // queue is empty and closed, remove it
      channelptr.reset();
      result.channelsRemoved++;
    }

    result.channelsPolled++;
  }

  // remove empty and closed channels
  _channels.erase(
    std::remove_if(
      _channels.begin(), _channels.end(),
      [](const std::shared_ptr<Channel>& channelptr) { return !channelptr; }
    ),
    _channels.end()
  );

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;

  return result;
}